

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

char * u_getTimeZoneFilesDirectory_63(UErrorCode *status)

{
  char *pcVar1;
  
  icu_63::umtx_initOnce(&gTimeZoneFilesInitOnce_63,TimeZoneDataDirInitFn,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar1 = (gTimeZoneFilesDirectory->buffer).ptr;
  }
  else {
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

U_CAPI const char * U_EXPORT2
u_getTimeZoneFilesDirectory(UErrorCode *status) {
    umtx_initOnce(gTimeZoneFilesInitOnce, &TimeZoneDataDirInitFn, *status);
    return U_SUCCESS(*status) ? gTimeZoneFilesDirectory->data() : "";
}